

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_set_source_membership4
              (uv_udp_t *handle,sockaddr_in *multicast_addr,char *interface_addr,
              sockaddr_in *source_addr,uv_membership membership)

{
  int iVar1;
  int *piVar2;
  int local_44;
  int err;
  int optname;
  ip_mreq_source mreq;
  uv_membership membership_local;
  sockaddr_in *source_addr_local;
  char *interface_addr_local;
  sockaddr_in *multicast_addr_local;
  uv_udp_t *handle_local;
  
  mreq.imr_interface.s_addr = membership;
  unique0x10000113 = source_addr;
  handle_local._4_4_ = uv__udp_maybe_deferred_bind(handle,2,4);
  if (handle_local._4_4_ == 0) {
    memset(&err,0,0xc);
    if (interface_addr == (char *)0x0) {
      optname = htonl(0);
    }
    else {
      iVar1 = uv_inet_pton(2,interface_addr,&optname);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    err = (multicast_addr->sin_addr).s_addr;
    mreq.imr_multiaddr.s_addr = (stack0xffffffffffffffd0->sin_addr).s_addr;
    if (mreq.imr_interface.s_addr == 1) {
      local_44 = 0x27;
    }
    else {
      if (mreq.imr_interface.s_addr != 0) {
        return -0x16;
      }
      local_44 = 0x28;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0,local_44,&err,0xc);
    if (iVar1 == 0) {
      handle_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      handle_local._4_4_ = -*piVar2;
    }
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__udp_set_source_membership4(uv_udp_t* handle,
                                          const struct sockaddr_in* multicast_addr,
                                          const char* interface_addr,
                                          const struct sockaddr_in* source_addr,
                                          uv_membership membership) {
  struct ip_mreq_source mreq;
  int optname;
  int err;

  err = uv__udp_maybe_deferred_bind(handle, AF_INET, UV_UDP_REUSEADDR);
  if (err)
    return err;

  memset(&mreq, 0, sizeof(mreq));

  if (interface_addr != NULL) {
    err = uv_inet_pton(AF_INET, interface_addr, &mreq.imr_interface.s_addr);
    if (err)
      return err;
  } else {
    mreq.imr_interface.s_addr = htonl(INADDR_ANY);
  }

  mreq.imr_multiaddr.s_addr = multicast_addr->sin_addr.s_addr;
  mreq.imr_sourceaddr.s_addr = source_addr->sin_addr.s_addr;

  if (membership == UV_JOIN_GROUP)
    optname = IP_ADD_SOURCE_MEMBERSHIP;
  else if (membership == UV_LEAVE_GROUP)
    optname = IP_DROP_SOURCE_MEMBERSHIP;
  else
    return UV_EINVAL;

  if (setsockopt(handle->io_watcher.fd,
                 IPPROTO_IP,
                 optname,
                 &mreq,
                 sizeof(mreq))) {
    return UV__ERR(errno);
  }

  return 0;
}